

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_PlayerObj(FParser *this)

{
  AActor *pAVar1;
  player_t *local_20;
  player_t *pl;
  int plnum;
  FParser *this_local;
  
  if (this->t_argc == 0) {
    local_20 = (player_t *)0x0;
    pAVar1 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->Script->trigger);
    if (pAVar1 != (AActor *)0x0) {
      pAVar1 = TObjPtr<AActor>::operator->(&this->Script->trigger);
      local_20 = pAVar1->player;
    }
    if (local_20 == (player_t *)0x0) {
      pl._4_4_ = -1;
    }
    else {
      pl._4_4_ = (int)((long)(local_20[-0xa3fb].weapons.Slots + 4) / 0x2a0);
    }
  }
  else {
    pl._4_4_ = T_GetPlayerNum(this->t_argv);
  }
  if (pl._4_4_ == -1) {
    script_error("script not started by player\n");
  }
  else {
    (this->t_return).type = 2;
    (this->t_return).value =
         *(anon_union_8_3_837bfa25_for_value *)(&players + (long)pl._4_4_ * 0x54);
  }
  return;
}

Assistant:

void FParser::SF_PlayerObj(void)
{
	int plnum;

	if(!t_argc)
	{
		player_t *pl=NULL;
		if (Script->trigger) pl = Script->trigger->player;
		if(pl) plnum = int(pl - players);
		else plnum=-1;
	}
	else
		plnum = T_GetPlayerNum(t_argv[0]);

	if(plnum !=-1)
	{
		t_return.type = svt_mobj;
		t_return.value.mobj = players[plnum].mo;
	}
	else
	{
		script_error("script not started by player\n");
	}
}